

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

int __thiscall gl4cts::SparseTextureTests::init(SparseTextureTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TextureParameterQueriesTestCase *this_00;
  InternalFormatQueriesTestCase *this_01;
  TestNode *pTVar1;
  SparseTextureAllocationTestCase *this_02;
  SparseTextureCommitmentTestCase *this_03;
  
  this_00 = (TextureParameterQueriesTestCase *)operator_new(0x230);
  TextureParameterQueriesTestCase::TextureParameterQueriesTestCase
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (InternalFormatQueriesTestCase *)operator_new(0x230);
  InternalFormatQueriesTestCase::InternalFormatQueriesTestCase
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pTVar1 = (TestNode *)operator_new(0x78);
  SimpleQueriesTestCase::SimpleQueriesTestCase
            ((SimpleQueriesTestCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_02 = (SparseTextureAllocationTestCase *)operator_new(0x248);
  SparseTextureAllocationTestCase::SparseTextureAllocationTestCase
            (this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (SparseTextureCommitmentTestCase *)operator_new(0x260);
  SparseTextureCommitmentTestCase::SparseTextureCommitmentTestCase
            (this_03,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  pTVar1 = (TestNode *)operator_new(0x260);
  SparseDSATextureCommitmentTestCase::SparseDSATextureCommitmentTestCase
            ((SparseDSATextureCommitmentTestCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void SparseTextureTests::init()
{
	addChild(new TextureParameterQueriesTestCase(m_context));
	addChild(new InternalFormatQueriesTestCase(m_context));
	addChild(new SimpleQueriesTestCase(m_context));
	addChild(new SparseTextureAllocationTestCase(m_context));
	addChild(new SparseTextureCommitmentTestCase(m_context));
	addChild(new SparseDSATextureCommitmentTestCase(m_context));
}